

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  ImGuiWindow *pIVar6;
  char *__function;
  ImGuiContext *g;
  
  pIVar4 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  Columns(1,"#CloseColumns",true);
  PopClipRect();
  if ((pIVar6->Flags & 0x100000) == 0) {
    LogFinish();
  }
  iVar2 = (pIVar4->CurrentWindowStack).Size;
  if (0 < iVar2) {
    uVar1 = iVar2 - 1;
    (pIVar4->CurrentWindowStack).Size = uVar1;
    if ((pIVar6->Flags & 0x2000000) != 0) {
      iVar3 = (pIVar4->CurrentPopupStack).Size;
      if (iVar3 < 1) {
        __function = "void ImVector<ImGuiPopupRef>::pop_back() [T = ImGuiPopupRef]";
        goto LAB_001240e7;
      }
      (pIVar4->CurrentPopupStack).Size = iVar3 + -1;
    }
    pIVar5 = GImGui;
    if ((pIVar6->DC).StackSizesBackup[0] != (pIVar6->IDStack).Size) {
      __assert_fail("*p_backup == current && \"PushID/PopID Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0xe46,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).StackSizesBackup[1] != (pIVar6->DC).GroupStack.Size) {
      __assert_fail("*p_backup == current && \"BeginGroup/EndGroup Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0xe47,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).StackSizesBackup[2] != (GImGui->CurrentPopupStack).Size) {
      __assert_fail("*p_backup == current && \"BeginMenu/EndMenu or BeginPopup/EndPopup Mismatch\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0xe48,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    if ((pIVar6->DC).StackSizesBackup[3] == (GImGui->ColorModifiers).Size) {
      if ((pIVar6->DC).StackSizesBackup[4] != (GImGui->StyleModifiers).Size) {
        __assert_fail("*p_backup == current && \"PushStyleVar/PopStyleVar Mismatch!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                      ,0xe4a,"void CheckStacksSize(ImGuiWindow *, bool)");
      }
      if ((pIVar6->DC).StackSizesBackup[5] == (GImGui->FontStack).Size) {
        if (uVar1 == 0) {
          pIVar6 = (ImGuiWindow *)0x0;
        }
        else {
          if (iVar2 == 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                          ,0x365,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
          }
          pIVar6 = (pIVar4->CurrentWindowStack).Data[(ulong)uVar1 - 1];
        }
        GImGui->CurrentWindow = pIVar6;
        if (pIVar6 != (ImGuiWindow *)0x0) {
          pIVar5->FontSize = pIVar5->FontBaseSize * pIVar6->FontWindowScale;
        }
        return;
      }
      __assert_fail("*p_backup == current && \"PushFont/PopFont Mismatch!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                    ,0xe4b,"void CheckStacksSize(ImGuiWindow *, bool)");
    }
    __assert_fail("*p_backup == current && \"PushStyleColor/PopStyleColor Mismatch!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.cpp"
                  ,0xe49,"void CheckStacksSize(ImGuiWindow *, bool)");
  }
  __function = "void ImVector<ImGuiWindow *>::pop_back() [T = ImGuiWindow *]";
LAB_001240e7:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x378,__function);
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    Columns(1, "#CloseColumns");
    PopClipRect();   // inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop
    // NB: we don't clear 'window->RootWindow'. The pointer is allowed to live until the next call to Begin().
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}